

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr
GetGenericClassTypeName(ExpressionContext *ctx,TypeBase *proto,IntrusiveList<TypeHandle> generics)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  TypeHandle *local_60;
  TypeHandle *arg_1;
  char *pos;
  char *name;
  TypeHandle *arg;
  uint nameLength;
  TypeBase *proto_local;
  ExpressionContext *ctx_local;
  IntrusiveList<TypeHandle> generics_local;
  char *__s;
  
  generics_local.head = generics.tail;
  uVar2 = InplaceStr::length(&proto->name);
  arg._4_4_ = uVar2 + 3;
  local_60 = generics.head;
  for (name = (char *)local_60; name != (char *)0x0; name = *(char **)(name + 8)) {
    if ((*(byte *)(*(long *)name + 0x3c) & 1) == 0) {
      uVar2 = InplaceStr::length((InplaceStr *)(*(long *)name + 0x10));
      arg._4_4_ = uVar2 + arg._4_4_;
    }
    else {
      arg._4_4_ = arg._4_4_ + 7;
    }
    if (*(long *)(name + 8) != 0) {
      arg._4_4_ = arg._4_4_ + 1;
    }
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)arg._4_4_);
  __s = (char *)CONCAT44(extraout_var,iVar3);
  pcVar1 = (proto->name).begin;
  uVar2 = InplaceStr::length(&proto->name);
  memcpy(__s,pcVar1,(ulong)uVar2);
  uVar2 = InplaceStr::length(&proto->name);
  strcpy(__s + uVar2,"<");
  arg_1 = (TypeHandle *)(__s + uVar2 + 1);
  for (; local_60 != (TypeHandle *)0x0; local_60 = local_60->next) {
    if ((local_60->type->isGeneric & 1U) == 0) {
      pcVar1 = (local_60->type->name).begin;
      uVar2 = InplaceStr::length(&local_60->type->name);
      memcpy(arg_1,pcVar1,(ulong)uVar2);
      uVar2 = InplaceStr::length(&local_60->type->name);
      arg_1 = (TypeHandle *)((long)&arg_1->type + (ulong)uVar2);
    }
    else {
      strcpy((char *)arg_1,"generic");
      arg_1 = (TypeHandle *)((long)&arg_1->type + 7);
    }
    if (local_60->next != (TypeHandle *)0x0) {
      *(undefined1 *)&arg_1->type = 0x2c;
      arg_1 = (TypeHandle *)((long)&arg_1->type + 1);
    }
  }
  *(undefined1 *)&arg_1->type = 0x3e;
  *(undefined1 *)((long)&arg_1->type + 1) = 0;
  sVar4 = strlen(__s);
  if (sVar4 + 1 == (ulong)arg._4_4_) {
    InplaceStr::InplaceStr((InplaceStr *)&generics_local.tail,__s);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x108,
                "InplaceStr GetGenericClassTypeName(ExpressionContext &, TypeBase *, IntrusiveList<TypeHandle>)"
               );
}

Assistant:

InplaceStr GetGenericClassTypeName(ExpressionContext &ctx, TypeBase* proto, IntrusiveList<TypeHandle> generics)
{
	unsigned nameLength = proto->name.length() + unsigned(strlen("<>")) + 1;

	for(TypeHandle *arg = generics.head; arg; arg = arg->next)
	{
		if(arg->type->isGeneric)
			nameLength += unsigned(strlen("generic"));
		else
			nameLength += arg->type->name.length();

		if(arg->next)
			nameLength += 1;
	}

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, proto->name.begin, proto->name.length());
	pos += proto->name.length();

	strcpy(pos, "<");
	pos += 1;

	for(TypeHandle *arg = generics.head; arg; arg = arg->next)
	{
		if(arg->type->isGeneric)
		{
			strcpy(pos, "generic");
			pos += strlen("generic");
		}
		else
		{
			memcpy(pos, arg->type->name.begin, arg->type->name.length());
			pos += arg->type->name.length();
		}

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = '>';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}